

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

Aig_ManCut_t * Aig_ComputeCuts(Aig_Man_t *pAig,int nCutsMax,int nLeafMax,int fTruth,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  uint local_48;
  uint local_44;
  int nCutsK;
  int nCuts;
  abctime clk;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pObj;
  Aig_ManCut_t *p;
  int fVerbose_local;
  int fTruth_local;
  int nLeafMax_local;
  int nCutsMax_local;
  Aig_Man_t *pAig_local;
  
  p._0_4_ = fVerbose;
  p._4_4_ = fTruth;
  fVerbose_local = nLeafMax;
  fTruth_local = nCutsMax;
  _nLeafMax_local = pAig;
  _nCutsK = Abc_Clock();
  if (_nLeafMax_local->pManCuts != (void *)0x0) {
    __assert_fail("pAig->pManCuts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                  ,0x27d,"Aig_ManCut_t *Aig_ComputeCuts(Aig_Man_t *, int, int, int, int)");
  }
  pObj = (Aig_Obj_t *)Aig_ManCutStart(_nLeafMax_local,fTruth_local,fVerbose_local,p._4_4_,(int)p);
  for (clk._4_4_ = 0; iVar2 = clk._4_4_, iVar1 = Vec_PtrSize(_nLeafMax_local->vCis), iVar2 < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pAStack_30 = (Aig_Obj_t *)Vec_PtrEntry(_nLeafMax_local->vCis,clk._4_4_);
    Aig_ObjPrepareCuts((Aig_ManCut_t *)pObj,pAStack_30,1);
  }
  for (clk._4_4_ = 0; iVar2 = clk._4_4_, iVar1 = Vec_PtrSize(_nLeafMax_local->vObjs), iVar2 < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pAStack_30 = (Aig_Obj_t *)Vec_PtrEntry(_nLeafMax_local->vObjs,clk._4_4_);
    if ((pAStack_30 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAStack_30), iVar2 != 0)) {
      Aig_ObjComputeCuts((Aig_ManCut_t *)pObj,pAStack_30,1);
    }
  }
  if ((int)p != 0) {
    local_44 = Aig_ManCutCount((Aig_ManCut_t *)pObj,(int *)&local_48);
    uVar3 = Aig_ManObjNum(_nLeafMax_local);
    printf("Nodes = %6d. Total cuts = %6d. %d-input cuts = %6d.\n",(ulong)uVar3,(ulong)local_44,
           (ulong)(uint)fVerbose_local,(ulong)local_48);
    uVar3 = pObj->TravId;
    iVar2 = pObj->Id;
    iVar1 = Aig_MmFixedReadMemUsage((Aig_MmFixed_t *)(pObj->field_5).pData);
    printf("Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
           ((double)iVar1 * 1.0) / 1048576.0,(ulong)uVar3,(ulong)(uint)(iVar2 << 2));
    Abc_Print(1,"%s =","Runtime");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - _nCutsK) * 1.0) / 1000000.0);
  }
  _nLeafMax_local->pManCuts = pObj;
  return (Aig_ManCut_t *)pObj;
}

Assistant:

Aig_ManCut_t * Aig_ComputeCuts( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fTruth, int fVerbose )
{
    Aig_ManCut_t * p;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    assert( pAig->pManCuts == NULL );
    // start the manager
    p = Aig_ManCutStart( pAig, nCutsMax, nLeafMax, fTruth, fVerbose );
    // set elementary cuts at the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        Aig_ObjPrepareCuts( p, pObj, 1 );
    // process the nodes
    Aig_ManForEachNode( pAig, pObj, i )
        Aig_ObjComputeCuts( p, pObj, 1 );
    // print stats
    if ( fVerbose )
    {
        int nCuts, nCutsK;
        nCuts = Aig_ManCutCount( p, &nCutsK );
        printf( "Nodes = %6d. Total cuts = %6d. %d-input cuts = %6d.\n",
            Aig_ManObjNum(pAig), nCuts, nLeafMax, nCutsK );
        printf( "Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
            p->nCutSize, 4*p->nTruthWords, 1.0*Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
/*
        Aig_ManForEachNode( pAig, pObj, i )
            if ( i % 300 == 0 )
                Aig_ObjCutPrint( p, pObj );
*/
    }
    // remember the cut manager
    pAig->pManCuts = p;
    return p;
}